

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase1294::run(TestCase1294 *this)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  void *pvVar2;
  PromiseBase location_00;
  bool called;
  void *continuationTracePtr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_128;
  Promise<void> promise;
  anon_class_8_1_4f9d58bb_for_func local_118;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_110;
  WaitScope waitScope;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_a0;
  EventLoop loop;
  
  called = false;
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)&local_128);
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1300:57)>
       ::anon_class_8_1_4f9d58bb_for_func::operator();
  pPVar1 = ((local_128.ptr)->super_PromiseArenaMember).arena;
  local_118.called = &called;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_128.ptr - (long)pPVar1) < 0x28) {
    pvVar2 = operator_new(0x400);
    location_00.node.ptr = (OwnPromiseNode)((long)pvVar2 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase1294::run()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase1294::run()::__0,void*&>
              ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1300:57)>
                *)location_00.node.ptr,&local_128,&local_118,&continuationTracePtr);
    *(void **)((long)pvVar2 + 0x3e0) = pvVar2;
  }
  else {
    ((local_128.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_00.node.ptr = (OwnPromiseNode)&local_128.ptr[-3].super_PromiseArenaMember.arena;
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase1294::run()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase1294::run()::__0,void*&>
              ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1300:57)>
                *)location_00.node.ptr,&local_128,&local_118,&continuationTracePtr);
    local_128.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_110.ptr = (PromiseNode *)0x0;
  local_a0.ptr = (PromiseNode *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)location_00.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_a0);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_110);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_128);
  yield();
  Promise<void>::wait((Promise<void> *)&continuationTracePtr,&waitScope);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&continuationTracePtr);
  continuationTracePtr = (void *)(CONCAT71(continuationTracePtr._1_7_,called) ^ 1);
  if ((called != false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[27],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x519,ERROR,"\"failed: expected \" \"!(called)\", _kjCondition",
               (char (*) [27])"failed: expected !(called)",
               (DebugExpression<bool> *)&continuationTracePtr);
  }
  location.function = "run";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location.lineNumber = 0x51b;
  location.columnNumber = 0xd;
  Promise<void>::eagerlyEvaluate((Promise<void> *)&continuationTracePtr,&promise,location);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise,
             (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&continuationTracePtr);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&continuationTracePtr);
  yield();
  Promise<void>::wait((Promise<void> *)&continuationTracePtr,&waitScope);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&continuationTracePtr);
  continuationTracePtr = &called;
  if ((called == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[24],kj::_::DebugExpression<bool&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x51f,ERROR,"\"failed: expected \" \"called\", _kjCondition",
               (char (*) [24])"failed: expected called",
               (DebugExpression<bool_&> *)&continuationTracePtr);
  }
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, EagerlyEvaluate) {
  bool called = false;

  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<void> promise = Promise<void>(READY_NOW).then([&]() {
    called = true;
  });
  yield().wait(waitScope);

  EXPECT_FALSE(called);

  promise = promise.eagerlyEvaluate(nullptr);

  yield().wait(waitScope);

  EXPECT_TRUE(called);
}